

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O2

void FILECleanUpLockedRgn(SHMPTR shmFileLocks,DWORD dwAccessRights,PVOID pvControllerInstance)

{
  SHMPTR *pSVar1;
  DWORD DVar2;
  SHMPTR SVar3;
  DWORD DVar4;
  SHMPTR *pSVar5;
  DWORD *pDVar6;
  LPVOID pvVar7;
  LPVOID pvVar8;
  undefined8 uVar9;
  SHMPTR shmptr;
  DWORD *pDVar10;
  DWORD *pDVar11;
  
  SHMLock();
  if (shmFileLocks == 0) goto LAB_0032596d;
  pSVar5 = (SHMPTR *)SHMPtrToPtr(shmFileLocks);
  if (pSVar5 == (SHMPTR *)0x0) {
    uVar9 = 0x39e;
  }
  else {
    shmptr = pSVar5[1];
    if (shmptr == 0) {
LAB_00325810:
      if ((int)dwAccessRights < 0) {
        *(int *)((long)pSVar5 + 0x2c) = *(int *)((long)pSVar5 + 0x2c) + -1;
      }
      if ((dwAccessRights >> 0x1e & 1) != 0) {
        *(int *)(pSVar5 + 6) = (int)pSVar5[6] + -1;
      }
      pSVar1 = pSVar5 + 2;
      *(int *)pSVar1 = (int)*pSVar1 + -1;
      if (((int)*pSVar1 != 0) || (pSVar5[1] != 0)) goto LAB_0032596d;
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_003259bf:
        abort();
      }
      if (pSVar5[4] == 0) {
        pvVar7 = (LPVOID)0x0;
LAB_0032591a:
        if (pSVar5[3] == 0) {
          pvVar8 = (LPVOID)0x0;
        }
        else {
          pvVar8 = SHMPtrToPtr(pSVar5[3]);
          if (pvVar8 == (LPVOID)0x0) goto LAB_00325930;
        }
        if (pvVar7 == (LPVOID)0x0) {
          SHMSetInfo(SIID_FILE_LOCKS,pSVar5[3]);
        }
        else {
          *(SHMPTR *)((long)pvVar7 + 0x18) = pSVar5[3];
        }
        if (pvVar8 != (LPVOID)0x0) {
          *(SHMPTR *)((long)pvVar8 + 0x20) = pSVar5[4];
        }
        if (*pSVar5 != 0) {
          SHMfree(*pSVar5);
        }
        SHMfree(shmFileLocks);
        goto LAB_0032596d;
      }
      pvVar7 = SHMPtrToPtr(pSVar5[4]);
      if (pvVar7 != (LPVOID)0x0) goto LAB_0032591a;
LAB_00325930:
      uVar9 = 0x3ec;
    }
    else {
      pDVar6 = (DWORD *)SHMPtrToPtr(shmptr);
      if (pDVar6 == (DWORD *)0x0) {
        uVar9 = 0x3a9;
      }
      else {
        pDVar10 = (DWORD *)0x0;
        do {
          while( true ) {
            pDVar11 = pDVar6;
            if (pDVar11 == (DWORD *)0x0) goto LAB_00325810;
            if ((*(PVOID *)(pDVar11 + 2) != pvControllerInstance) ||
               (DVar2 = *pDVar11, DVar4 = GetCurrentProcessId(), DVar2 != DVar4)) break;
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_003259bf;
            if (pDVar10 == (DWORD *)0x0) {
              pSVar5[1] = *(SHMPTR *)(pDVar11 + 10);
              SHMfree(shmptr);
              SVar3 = pSVar5[1];
              shmptr = 0;
              pDVar6 = (DWORD *)0x0;
              if ((SVar3 != 0) &&
                 (pDVar6 = (DWORD *)SHMPtrToPtr(SVar3), shmptr = SVar3, pDVar6 == (DWORD *)0x0)) {
                uVar9 = 0x3be;
                goto LAB_00325955;
              }
            }
            else {
              *(SHMPTR *)(pDVar10 + 10) = *(SHMPTR *)(pDVar11 + 10);
              SHMfree(shmptr);
              SVar3 = *(SHMPTR *)(pDVar10 + 10);
              shmptr = 0;
              pDVar6 = (DWORD *)0x0;
              if ((SVar3 != 0) &&
                 (pDVar6 = (DWORD *)SHMPtrToPtr(SVar3), shmptr = SVar3, pDVar6 == (DWORD *)0x0)) {
                uVar9 = 0x3c9;
                goto LAB_00325955;
              }
            }
          }
          shmptr = *(SHMPTR *)(pDVar11 + 10);
          pDVar6 = (DWORD *)0x0;
          pDVar10 = pDVar11;
        } while ((shmptr == 0) || (pDVar6 = (DWORD *)SHMPtrToPtr(shmptr), pDVar6 != (DWORD *)0x0));
        uVar9 = 0x3d4;
      }
    }
  }
LAB_00325955:
  fprintf(_stderr,"] %s %s:%d","FILECleanUpLockedRgn",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
          ,uVar9);
  fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
LAB_0032596d:
  SHMRelease();
  return;
}

Assistant:

void
FILECleanUpLockedRgn(
    SHMPTR shmFileLocks,
    DWORD dwAccessRights,
    PVOID pvControllerInstance
    )
{
    SHMFILELOCKRGNS *curLockRgn = NULL, *prevLock = NULL;
    SHMFILELOCKS *fileLocks, *prevFileLocks, *nextFileLocks;
    SHMPTR shmcurLockRgn;    

    SHMLock();

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        goto EXIT;
    }

    if (fileLocks != NULL)
    {
        if(fileLocks->fileLockedRgns !=0)
        {        
            shmcurLockRgn = fileLocks->fileLockedRgns;
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                goto EXIT;
            }
            
            while(curLockRgn != NULL)
            {
                if ((curLockRgn->pvControllerInstance == pvControllerInstance) && 
                    (curLockRgn->processId == GetCurrentProcessId()))
                {
                    /* found the locked rgn to remove from SHM */
                    TRACE("Removing the locked region (%I64u, %I64u) from SMH\n", 
                          curLockRgn->lockRgnStart, curLockRgn->nbBytesLocked);
                    
                    if (prevLock == NULL) 
                    {
                        /* removing the first lock */
                        fileLocks->fileLockedRgns = curLockRgn->next;
                        SHMfree(shmcurLockRgn);
                        shmcurLockRgn = fileLocks->fileLockedRgns;
                        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
                        {
                            ASSERT("Unable to get pointer from shm pointer.\n");
                            goto EXIT;
                        }
                    }
                    else
                    {
                        prevLock->next = curLockRgn->next;
                        SHMfree(shmcurLockRgn);
                        shmcurLockRgn = prevLock->next;
                        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
                        {
                            ASSERT("Unable to get pointer from shm pointer.\n");
                            goto EXIT;
                        }
                    }
                    continue;
                }
                
                prevLock = curLockRgn;
                shmcurLockRgn = curLockRgn->next;
                if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
                {
                    ASSERT("Unable to get pointer from shm pointer.\n");
                    goto EXIT;
                }
            }
        }
    
        if (dwAccessRights & GENERIC_READ)
        {   
            fileLocks->nbReadAccess--;      
        }
        if (dwAccessRights & GENERIC_WRITE)
        {
            fileLocks->nbWriteAccess--; 
        }  

        /* remove the SHMFILELOCKS structure from SHM if there's no more locked 
           region left and no more reference to it */        
        if ((--(fileLocks->refCount) == 0) && (fileLocks->fileLockedRgns == 0))
        {            
            TRACE("Removing the SHMFILELOCKS structure from SHM\n");

            if ( (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, prevFileLocks, fileLocks->prev) == FALSE) ||
                 (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, nextFileLocks, fileLocks->next) == FALSE))
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                goto EXIT;
            }

            if (prevFileLocks == NULL) 
            {
                /* removing the first lock file*/
                SHMSetInfo(SIID_FILE_LOCKS, fileLocks->next);
            }
            else
            {
                prevFileLocks->next = fileLocks->next;
            }

            if (nextFileLocks != NULL)
            {
                nextFileLocks->prev = fileLocks->prev;
            }

            if (fileLocks->unix_filename)
                SHMfree(fileLocks->unix_filename);

            SHMfree(shmFileLocks);
        }
    }    
EXIT:
    SHMRelease();
    return;
}